

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_code_options.c
# Opt level: O2

int check_splitting(test_state *state,int k)

{
  byte bVar1;
  int iVar2;
  uchar *puVar3;
  uchar *puVar4;
  undefined4 in_register_00000034;
  long lVar5;
  
  iVar2 = state->bytes_per_sample;
  lVar5 = (long)iVar2;
  puVar3 = state->ubuf;
  bVar1 = (byte)k;
  if ((state->strm->flags & 8) == 0) {
    for (puVar4 = puVar3; puVar4 < puVar3 + state->buf_len; puVar4 = puVar4 + lVar5 * 4) {
      (*state->out)(puVar4,0,iVar2);
      (*state->out)(puVar4 + lVar5,~(-1L << (bVar1 & 0x3f)),iVar2);
      (*state->out)(puVar4 + iVar2 * 2,0,iVar2);
      (*state->out)(puVar4 + iVar2 * 3,~(-1L << (bVar1 + 2 & 0x3f)),iVar2);
      puVar3 = state->ubuf;
    }
  }
  else {
    for (puVar4 = puVar3; puVar4 < puVar3 + state->buf_len; puVar4 = puVar4 + iVar2 * 4) {
      (*state->out)(puVar4,state->xmin + ~(-1L << (bVar1 - 1 & 0x3f)),iVar2);
      (*state->out)(puVar4 + lVar5,state->xmin,iVar2);
      (*state->out)(puVar4 + iVar2 * 2,state->xmin + ~(-1L << (bVar1 + 1 & 0x3f)),iVar2);
      (*state->out)(puVar4 + iVar2 * 3,state->xmin,iVar2);
      puVar3 = state->ubuf;
    }
  }
  printf("Checking splitting with k=%i ... ",CONCAT44(in_register_00000034,k));
  iVar2 = check_block_sizes(state,k + 1,state->id_len);
  if (iVar2 == 0) {
    puts("\x1b[0;32mPASS\x1b[0m");
  }
  return iVar2;
}

Assistant:

int check_splitting(struct test_state *state, int k)
{
    int status, size;
    unsigned char *tmp;

    size = state->bytes_per_sample;

    if (state->strm->flags & AEC_DATA_PREPROCESS) {
        for (tmp = state->ubuf;
             tmp < state->ubuf + state->buf_len;
             tmp += 4 * size) {
            state->out(tmp, state->xmin + (1ULL << (k - 1)) - 1, size);
            state->out(tmp + size, state->xmin, size);
            state->out(tmp + 2 * size, state->xmin
                       + (1ULL << (k + 1)) - 1, size);
            state->out(tmp + 3 * size, state->xmin, size);
        }
    } else {
        for (tmp = state->ubuf;
             tmp < state->ubuf + state->buf_len;
             tmp += 4 * size) {
            state->out(tmp, 0, size);
            state->out(tmp + size, (1ULL << k) - 1, size);
            state->out(tmp + 2 * size, 0, size);
            state->out(tmp + 3 * size, (1ULL << (k + 2)) - 1, size);
        }
    }

    printf("Checking splitting with k=%i ... ", k);
    status = check_block_sizes(state, k + 1, state->id_len);
    if (status)
        return status;

    printf ("%s\n", CHECK_PASS);
    return 0;
}